

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::Processor::addSpecialisationParameter(Processor *this,UsingDeclaration *u)

{
  pool_ref<soul::AST::UsingDeclaration> local_20;
  
  local_20.object = u;
  std::
  vector<soul::pool_ref<soul::AST::UsingDeclaration>,std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>>>
  ::emplace_back<soul::pool_ref<soul::AST::UsingDeclaration>>
            ((vector<soul::pool_ref<soul::AST::UsingDeclaration>,std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>>>
              *)&(this->super_ProcessorBase).super_ModuleBase.usings,&local_20);
  local_20.object = u;
  std::
  vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>
  ::emplace_back<soul::pool_ref<soul::AST::ASTObject>>
            ((vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>
              *)&(this->super_ProcessorBase).super_ModuleBase.specialisationParams,
             (pool_ref<soul::AST::ASTObject> *)&local_20);
  return;
}

Assistant:

void addSpecialisationParameter (UsingDeclaration& u) override
        {
            usings.push_back (u);
            specialisationParams.push_back (u);
        }